

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O2

QDBusArgument * operator<<(QDBusArgument *arg,QList<QDBusMenuItemKeys> *list)

{
  QDBusMenuItemKeys *keys;
  long lVar1;
  
  QDBusArgument::beginArray((QMetaType)arg);
  keys = (list->d).ptr;
  for (lVar1 = (list->d).size << 5; lVar1 != 0; lVar1 = lVar1 + -0x20) {
    operator<<(arg,keys);
    keys = keys + 1;
  }
  QDBusArgument::endArray();
  return arg;
}

Assistant:

inline QDBusArgument &operator<<(QDBusArgument &arg, const Container<T> &list)
{
    arg.beginArray(QMetaType::fromType<T>());
    typename Container<T>::const_iterator it = list.begin();
    typename Container<T>::const_iterator end = list.end();
    for ( ; it != end; ++it)
        arg << *it;
    arg.endArray();
    return arg;
}